

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O1

monotoneVectorsStruct * allocPointersToMonotoneVectors(void)

{
  monotoneVectorsStruct *pmVar1;
  
  pmVar1 = (monotoneVectorsStruct *)malloc(0x18);
  pmVar1->attrKnownMonotone = (Vec_Int_t *)0x0;
  pmVar1->attrCandMonotone = (Vec_Int_t *)0x0;
  pmVar1->attrHintMonotone = (Vec_Int_t *)0x0;
  return pmVar1;
}

Assistant:

struct monotoneVectorsStruct *allocPointersToMonotoneVectors()
{
	struct monotoneVectorsStruct *newPointersToMonotoneVectors;

	newPointersToMonotoneVectors = (struct monotoneVectorsStruct *)malloc(sizeof (struct monotoneVectorsStruct));

	newPointersToMonotoneVectors->attrKnownMonotone = NULL;
	newPointersToMonotoneVectors->attrCandMonotone = NULL;
	newPointersToMonotoneVectors->attrHintMonotone = NULL;
		
	assert( newPointersToMonotoneVectors != NULL );
	return newPointersToMonotoneVectors;
}